

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3tokConnectMethod
              (sqlite3 *db,void *pHash,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *p;
  Fts3HashElem *pFVar4;
  sqlite3_vtab *psVar5;
  char **ppcVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  uint uVar7;
  char *__src;
  sqlite3 *psVar8;
  sqlite3_vtab **ppsVar9;
  char **ppcVar10;
  ulong uVar11;
  char *pcVar12;
  sqlite3_module *psVar13;
  uint uVar14;
  ulong uVar15;
  sqlite3_tokenizer *pTok;
  sqlite3 *local_48;
  ulong local_40;
  char **local_38;
  
  local_48 = (sqlite3 *)0x0;
  __src = "CREATE TABLE x(input, token, start, end, position)";
  ppcVar6 = argv;
  ppsVar9 = ppVtab;
  ppcVar10 = pzErr;
  iVar1 = sqlite3_declare_vtab(db,"CREATE TABLE x(input, token, start, end, position)");
  if (iVar1 == 0) {
    uVar7 = argc - 3;
    local_38 = pzErr;
    if (uVar7 == 0) {
      p = (undefined8 *)0x0;
      iVar1 = 0;
      iVar2 = extraout_EDX;
    }
    else {
      uVar15 = 0;
      if (3 < argc) {
        uVar11 = 0;
        do {
          sVar3 = strlen(argv[uVar11 + 3]);
          uVar14 = (int)uVar15 + (int)sVar3 + 1;
          uVar15 = (ulong)uVar14;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
        uVar15 = (ulong)(int)uVar14;
      }
      iVar1 = sqlite3_initialize();
      if (iVar1 == 0) {
        p = (undefined8 *)sqlite3Malloc(uVar15 + (long)(int)uVar7 * 8);
        iVar2 = extraout_EDX_01;
      }
      else {
        p = (undefined8 *)0x0;
        iVar2 = extraout_EDX_00;
      }
      ppcVar6 = (char **)0x7;
      iVar1 = 0;
      if (p == (undefined8 *)0x0) {
        iVar1 = 7;
      }
      if ((3 < argc) && (p != (undefined8 *)0x0)) {
        pcVar12 = (char *)(p + (int)uVar7);
        uVar15 = 0;
        local_40 = (ulong)(uint)argc;
        do {
          sVar3 = strlen(argv[uVar15 + 3]);
          p[uVar15] = pcVar12;
          __src = argv[uVar15 + 3];
          sVar3 = (size_t)((int)sVar3 + 1);
          memcpy(pcVar12,__src,sVar3);
          sqlite3Fts3Dequote(pcVar12);
          pcVar12 = pcVar12 + sVar3;
          uVar15 = uVar15 + 1;
        } while (uVar7 != uVar15);
        argc = (int)local_40;
        iVar1 = 0;
        iVar2 = extraout_EDX_02;
      }
    }
    if (iVar1 == 0) {
      if (argc < 4) {
        pcVar12 = "simple";
      }
      else {
        pcVar12 = (char *)*p;
      }
      sVar3 = strlen(pcVar12);
      __src = pcVar12;
      pFVar4 = sqlite3Fts3HashFindElem((Fts3Hash *)pHash,pcVar12,(int)sVar3 + 1);
      iVar1 = 0;
      if (pFVar4 == (Fts3HashElem *)0x0) {
        psVar13 = (sqlite3_module *)0x0;
      }
      else {
        psVar13 = (sqlite3_module *)pFVar4->data;
      }
      iVar2 = extraout_EDX_03;
      if (psVar13 == (sqlite3_module *)0x0) {
        __src = "unknown tokenizer: %s";
        psVar13 = (sqlite3_module *)0x0;
        sqlite3Fts3ErrMsg(local_38,"unknown tokenizer: %s",pcVar12);
        iVar1 = 1;
        iVar2 = extraout_EDX_04;
      }
    }
    else {
      psVar13 = (sqlite3_module *)0x0;
    }
    if (iVar1 == 0) {
      __src = (char *)(p + 1);
      psVar8 = (sqlite3 *)0x0;
      if (4 < argc) {
        psVar8 = (sqlite3 *)(ulong)(argc - 4);
      }
      iVar1 = (*psVar13->xCreate)(psVar8,__src,(int)&local_48,ppcVar6,ppsVar9,ppcVar10);
      iVar2 = extraout_EDX_05;
    }
    if (iVar1 == 0) {
      iVar2 = sqlite3_initialize();
      iVar1 = 0;
      if (iVar2 == 0) {
        psVar5 = (sqlite3_vtab *)sqlite3Malloc(0x28);
        iVar2 = extraout_EDX_07;
      }
      else {
        psVar5 = (sqlite3_vtab *)0x0;
        iVar2 = extraout_EDX_06;
      }
      ppcVar6 = (char **)0x7;
      if (psVar5 == (sqlite3_vtab *)0x0) {
        iVar1 = 7;
      }
    }
    else {
      psVar5 = (sqlite3_vtab *)0x0;
    }
    if (iVar1 == 0) {
      psVar5->zErrMsg = (char *)0x0;
      psVar5[1].pModule = (sqlite3_module *)0x0;
      psVar5->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar5->nRef = 0;
      *(undefined8 *)&psVar5[1].nRef = 0;
      psVar5[1].pModule = psVar13;
      *(sqlite3 **)&psVar5[1].nRef = local_48;
      *ppVtab = psVar5;
    }
    else if (local_48 != (sqlite3 *)0x0) {
      (*psVar13->xConnect)(local_48,__src,iVar2,ppcVar6,ppsVar9,ppcVar10);
    }
    sqlite3_free(p);
  }
  return iVar1;
}

Assistant:

static int fts3tokConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pHash,                    /* Hash table of tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  Fts3tokTable *pTab = 0;
  const sqlite3_tokenizer_module *pMod = 0;
  sqlite3_tokenizer *pTok = 0;
  int rc;
  char **azDequote = 0;
  int nDequote;

  rc = sqlite3_declare_vtab(db, FTS3_TOK_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nDequote = argc-3;
  rc = fts3tokDequoteArray(nDequote, &argv[3], &azDequote);

  if( rc==SQLITE_OK ){
    const char *zModule;
    if( nDequote<1 ){
      zModule = "simple";
    }else{
      zModule = azDequote[0];
    }
    rc = fts3tokQueryTokenizer((Fts3Hash*)pHash, zModule, &pMod, pzErr);
  }

  assert( (rc==SQLITE_OK)==(pMod!=0) );
  if( rc==SQLITE_OK ){
    const char * const *azArg = (const char * const *)&azDequote[1];
    rc = pMod->xCreate((nDequote>1 ? nDequote-1 : 0), azArg, &pTok);
  }

  if( rc==SQLITE_OK ){
    pTab = (Fts3tokTable *)sqlite3_malloc(sizeof(Fts3tokTable));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    memset(pTab, 0, sizeof(Fts3tokTable));
    pTab->pMod = pMod;
    pTab->pTok = pTok;
    *ppVtab = &pTab->base;
  }else{
    if( pTok ){
      pMod->xDestroy(pTok);
    }
  }

  sqlite3_free(azDequote);
  return rc;
}